

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall Blip_Impulse_::fine_volume_unit(Blip_Impulse_ *this)

{
  int iVar1;
  int iVar2;
  imp_t *piVar3;
  long lVar4;
  imp_t *imp_in;
  imp_t temp [1536];
  
  scale_impulse(this,(uint)(ushort)this->offset << ((byte)this->fine_bits & 0x1f),temp);
  imp_in = this->impulses + (long)this->width * (long)this->res * 2;
  scale_impulse(this,(uint)(ushort)this->offset,imp_in);
  piVar3 = this->impulses;
  iVar1 = this->res;
  iVar2 = this->width;
  for (lVar4 = 0; (iVar1 / 2) * iVar2 * 2 != (int)lVar4; lVar4 = lVar4 + 1) {
    piVar3[lVar4 * 4] = imp_in[lVar4 * 2];
    piVar3[lVar4 * 4 + 1] = imp_in[lVar4 * 2 + 1];
    *(undefined4 *)(piVar3 + lVar4 * 4 + 2) = *(undefined4 *)(temp + lVar4 * 2);
  }
  return;
}

Assistant:

void Blip_Impulse_::fine_volume_unit()
{
	// to do: find way of merging in-place without temporary buffer
	
	imp_t temp [max_res * 2 * Blip_Buffer::widest_impulse_];
	scale_impulse( (offset & 0xffff) << fine_bits, temp );
	imp_t* imp2 = impulses + res * 2 * width;
	scale_impulse( offset & 0xffff, imp2 );
	
	// merge impulses
	imp_t* imp = impulses;
	imp_t* src2 = temp;
	for ( int n = res / 2 * 2 * width; n--; ) {
		*imp++ = *imp2++;
		*imp++ = *imp2++;
		*imp++ = *src2++;
		*imp++ = *src2++;
	}
}